

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

ExtPubkey * __thiscall
cfd::core::HDWallet::GeneratePubkey
          (ExtPubkey *__return_storage_ptr__,HDWallet *this,NetType network_type,string *string_path
          )

{
  undefined1 local_a0 [8];
  ExtPrivkey privkey;
  string *string_path_local;
  NetType network_type_local;
  HDWallet *this_local;
  
  privkey.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)string_path;
  ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_a0,&this->seed_,network_type);
  ExtPrivkey::DerivePubkey
            (__return_storage_ptr__,(ExtPrivkey *)local_a0,
             (string *)
             privkey.tweak_sum_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  ExtPrivkey::~ExtPrivkey((ExtPrivkey *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey HDWallet::GeneratePubkey(
    NetType network_type, const std::string& string_path) const {
  ExtPrivkey privkey(seed_, network_type);
  return privkey.DerivePubkey(string_path);
}